

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_operator_index_const(void)

{
  iterator begin;
  iterator end;
  iterator first;
  size_type length;
  const_reference piVar1;
  undefined4 local_50 [2];
  undefined4 local_48 [2];
  undefined4 local_40 [2];
  undefined4 local_38 [2];
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.next);
  first = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  length = std::array<int,_4UL>::size((array<int,_4UL> *)&span.member.next);
  vista::circular_view<int,4ul>::circular_view<int*>
            ((circular_view<int,4ul> *)local_30,begin,end,first,length);
  piVar1 = vista::circular_view<int,_4UL>::operator[]((circular_view<int,_4UL> *)local_30,0);
  local_38[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x392,"void api_fixed_suite::fixed_operator_index_const()",piVar1,local_38);
  piVar1 = vista::circular_view<int,_4UL>::operator[]((circular_view<int,_4UL> *)local_30,1);
  local_40[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x393,"void api_fixed_suite::fixed_operator_index_const()",piVar1,local_40);
  piVar1 = vista::circular_view<int,_4UL>::operator[]((circular_view<int,_4UL> *)local_30,2);
  local_48[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x394,"void api_fixed_suite::fixed_operator_index_const()",piVar1,local_48);
  piVar1 = vista::circular_view<int,_4UL>::operator[]((circular_view<int,_4UL> *)local_30,3);
  local_50[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x395,"void api_fixed_suite::fixed_operator_index_const()",piVar1,local_50);
  return;
}

Assistant:

void fixed_operator_index_const()
{
    std::array<int, 4> array = {11, 22, 33, 44};
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
}